

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O1

ostream * plot::detail::operator<<(ostream *stream,foreground_setter *setter)

{
  TerminalMode TVar1;
  int iVar2;
  Color c;
  pair<plot::Color,_std::pair<int,_bool>_> *ppVar3;
  bool bVar4;
  ostream *poVar5;
  long lVar6;
  pair<plot::Color,_std::pair<int,_bool>_> *__it2;
  char in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  undefined8 in_stack_ffffffffffffffc8;
  
  TVar1 = setter->mode;
  if (TVar1 == Iso24bit) {
    Color::color32((Color *)&stack0xffffffffffffffc0,0xff,0xff);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\x1b[38;2;",7);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&stack0xffffffffffffffc0,1);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&stack0xffffffffffffffc0,1);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  }
  else if (TVar1 == Ansi256) {
    c._1_7_ = in_stack_ffffffffffffffc1;
    c.r._0_1_ = in_stack_ffffffffffffffc0;
    c._8_8_ = in_stack_ffffffffffffffc8;
    ansi::detail::find_color256(c);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\x1b[38;5;",7);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  }
  else {
    if (TVar1 != Ansi) {
      return stream;
    }
    lVar6 = 0x18;
    __it2 = (pair<plot::Color,_std::pair<int,_bool>_> *)&ansi::detail::palette;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_comp_iter<plot::ansi::detail::find_palette_entry(plot::Color)::{lambda(auto:1_const&,auto:2_const&)#1}>
              ::operator()(&stack0xffffffffffffffc0,
                           (pair<plot::Color,_std::pair<int,_bool>_> *)
                           ((long)&ansi::detail::palette + lVar6),__it2);
      ppVar3 = (pair<plot::Color,_std::pair<int,_bool>_> *)((long)&ansi::detail::palette + lVar6);
      if (!bVar4) {
        ppVar3 = __it2;
      }
      __it2 = ppVar3;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x180);
    iVar2 = (__it2->second).first;
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\x1b[",2);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)stream,iVar2 + 0x1e);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&stack0xffffffffffffffc0,1);
  return poVar5;
}

Assistant:

inline std::ostream& operator<<(std::ostream& stream, foreground_setter const& setter) {
        switch (setter.mode) {
            case TerminalMode::Ansi:
                return stream << ansi::foreground(setter.color);
            case TerminalMode::Ansi256:
                return stream << ansi::foreground256(setter.color);
            case TerminalMode::Iso24bit:
                return stream << ansi::foreground24bit(setter.color);
            default:
                return stream;
        }
    }